

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_2,_1> __thiscall tcu::operator*(tcu *this,Matrix<float,_2,_1> *mtx,float scalar)

{
  Matrix<float,_2,_1> MVar1;
  float *pfVar2;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  undefined4 local_28;
  undefined4 local_24;
  int row;
  int col;
  float scalar_local;
  Matrix<float,_2,_1> *mtx_local;
  Matrix<float,_2,_1> *res;
  
  Matrix<float,_2,_1>::Matrix((Matrix<float,_2,_1> *)this);
  fVar3 = extraout_XMM0_Da;
  fVar4 = extraout_XMM0_Db;
  for (local_24 = 0; local_24 < 1; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      pfVar2 = Matrix<float,_2,_1>::operator()(mtx,local_28,local_24);
      fVar3 = *pfVar2 * scalar;
      pfVar2 = Matrix<float,_2,_1>::operator()((Matrix<float,_2,_1> *)this,local_28,local_24);
      fVar4 = 0.0;
      *pfVar2 = fVar3;
    }
  }
  MVar1.m_data.m_data[0].m_data[1] = fVar4;
  MVar1.m_data.m_data[0].m_data[0] = fVar3;
  return (Matrix<float,_2,_1>)MVar1.m_data.m_data[0].m_data;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}